

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::values::abstract_value<unsigned_short>::~abstract_value
          (abstract_value<unsigned_short> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Atomic_word *p_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_0013b8d0;
  pcVar3 = (this->m_implicit_value)._M_dataplus._M_p;
  paVar1 = &(this->m_implicit_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_default_value)._M_dataplus._M_p;
  paVar1 = &(this->m_default_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->m_result).super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
           super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

abstract_value(const abstract_value& rhs)
            {
                if (rhs.m_result)
                {
                    m_result = std::make_shared<T>();
                    m_store = m_result.get();
                }
                else
                {
                    m_store = rhs.m_store;
                }

                m_default = rhs.m_default;
                m_implicit = rhs.m_implicit;
                m_default_value = rhs.m_default_value;
                m_implicit_value = rhs.m_implicit_value;
            }